

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O1

void __thiscall
TEST_MockSupportTest_setDataForUnsignedIntegerValues_Test::testBody
          (TEST_MockSupportTest_setDataForUnsignedIntegerValues_Test *this)

{
  uint uVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_88;
  SimpleString local_78;
  MockNamedValue local_68;
  
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar2 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"data");
  MockSupport::setData(pMVar2,&local_88,7);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_88,"");
  pMVar2 = mock(&local_88,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"data");
  MockSupport::getData(&local_68,pMVar2,&local_78);
  uVar1 = MockNamedValue::getUnsignedIntValue(&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,7,(ulong)uVar1,
             "LONGS_EQUAL(expected_data, mock().getData(\"data\").getUnsignedIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x35,pTVar4);
  MockNamedValue::~MockNamedValue(&local_68);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_88);
  return;
}

Assistant:

TEST(MockSupportTest, setDataForUnsignedIntegerValues)
{
    unsigned int expected_data = 7;
    mock().setData("data", expected_data);
    LONGS_EQUAL(expected_data, mock().getData("data").getUnsignedIntValue());
}